

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O2

void gen_mffsce(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  TCGv_i32 arg3;
  uintptr_t o_1;
  uintptr_t o;
  
  if ((ctx->insns_flags2 & 0x80000) == 0) {
    return;
  }
  if (ctx->fpu_enabled != false) {
    tcg_ctx = ctx->uc->tcg_ctx;
    ret = tcg_temp_new_i64(tcg_ctx);
    gen_reset_fpstatus(tcg_ctx);
    tcg_gen_mov_i64_ppc64(tcg_ctx,ret,cpu_fpscr);
    set_fpr(tcg_ctx,ctx->opcode >> 0x15 & 0x1f,ret);
    tcg_gen_andi_i64_ppc64(tcg_ctx,ret,ret,-0xf9);
    arg3 = tcg_const_i32_ppc64(tcg_ctx,3);
    gen_helper_store_fpscr(tcg_ctx,tcg_ctx->cpu_env,ret,arg3);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(arg3 + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    return;
  }
  gen_exception(ctx,7);
  return;
}

Assistant:

static void gen_mffsce(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t0;
    TCGv_i32 mask;

    if (unlikely(!(ctx->insns_flags2 & PPC2_ISA300))) {
        return;
    }

    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }

    t0 = tcg_temp_new_i64(tcg_ctx);

    gen_reset_fpstatus(tcg_ctx);
    tcg_gen_extu_tl_i64(tcg_ctx, t0, cpu_fpscr);
    set_fpr(tcg_ctx, rD(ctx->opcode), t0);

    /* Clear exception enable bits in the FPSCR.  */
    tcg_gen_andi_i64(tcg_ctx, t0, t0, ~FP_ENABLES);
    mask = tcg_const_i32(tcg_ctx, 0x0003);
    gen_helper_store_fpscr(tcg_ctx, tcg_ctx->cpu_env, t0, mask);

    tcg_temp_free_i32(tcg_ctx, mask);
    tcg_temp_free_i64(tcg_ctx, t0);
}